

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  float *this;
  ImDrawList *pIVar1;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id_00;
  ImU32 fill_col;
  ImGuiWindow *this_00;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  char *local_158;
  char *local_150;
  ImGuiCol local_114;
  float local_fc;
  ImVec2 local_e0;
  ImVec2 label_pos;
  ImVec2 IStack_c4;
  float pad_1;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 pad;
  bool mixed_value;
  ImU32 check_col;
  ImVec2 local_94;
  ImVec2 local_8c;
  undefined1 local_84 [8];
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_68;
  undefined1 local_60 [8];
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool *v_local;
  char *label_local;
  
  this_00 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this_00->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this_00,label,(char *)0x0);
    IVar6 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar4 = GetFrameHeight();
    total_bb.Max = (this_00->DC).CursorPos;
    pos.y = IVar6.x;
    if (pos.y <= 0.0) {
      local_fc = 0.0;
    }
    else {
      local_fc = (pIVar2->Style).ItemInnerSpacing.x + pos.y;
    }
    square_sz = IVar6.y;
    fVar5 = (pIVar2->Style).FramePadding.y;
    this = &check_bb.Max.y;
    ImVec2::ImVec2((ImVec2 *)this,fVar4 + local_fc,fVar5 + fVar5 + square_sz);
    local_68 = ::operator+(&total_bb.Max,(ImVec2 *)this);
    ImRect::ImRect((ImRect *)local_60,&total_bb.Max,&local_68);
    ItemSize((ImRect *)local_60,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_60,id_00,(ImRect *)0x0,0);
    if (bVar3) {
      check_bb.Max.x._1_1_ =
           ButtonBehavior((ImRect *)local_60,id_00,(bool *)((long)&check_bb.Max.x + 3),
                          (bool *)((long)&check_bb.Max.x + 2),0);
      if ((bool)check_bb.Max.x._1_1_) {
        *v = (bool)((*v ^ 0xffU) & 1);
        MarkItemEdited(id_00);
      }
      ImVec2::ImVec2(&local_94,fVar4,fVar4);
      local_8c = ::operator+(&total_bb.Max,&local_94);
      ImRect::ImRect((ImRect *)local_84,&total_bb.Max,&local_8c);
      RenderNavHighlight((ImRect *)local_60,id_00,1);
      IVar6.y = (float)local_84._4_4_;
      IVar6.x = (float)local_84._0_4_;
      p_max.y = check_bb.Min.y;
      p_max.x = check_bb.Min.x;
      if (((check_bb.Max.x._2_1_ & 1) == 0) || ((check_bb.Max.x._3_1_ & 1) == 0)) {
        local_114 = 7;
        if ((check_bb.Max.x._3_1_ & 1) != 0) {
          local_114 = 8;
        }
      }
      else {
        local_114 = 9;
      }
      fill_col = GetColorU32(local_114,1.0);
      RenderFrame(IVar6,p_max,fill_col,true,(pIVar2->Style).FrameRounding);
      pad.y = (float)GetColorU32(0x12,1.0);
      pad.x._3_1_ = ((pIVar2->LastItemData).InFlags & 0x40U) != 0;
      if ((bool)pad.x._3_1_) {
        fVar5 = ImMax<float>(1.0,(float)(int)(fVar4 / 3.6));
        fVar4 = ImMax<float>(1.0,(float)(int)(fVar4 / 3.6));
        ImVec2::ImVec2(&local_b4,fVar5,fVar4);
        pIVar1 = this_00->DrawList;
        local_bc = ::operator+((ImVec2 *)local_84,&local_b4);
        IStack_c4 = ::operator-(&check_bb.Min,&local_b4);
        ImDrawList::AddRectFilled
                  (pIVar1,&local_bc,&stack0xffffffffffffff3c,(ImU32)pad.y,
                   (pIVar2->Style).FrameRounding,0);
      }
      else if ((*v & 1U) != 0) {
        fVar5 = ImMax<float>(1.0,(float)(int)(fVar4 / 6.0));
        pIVar1 = this_00->DrawList;
        ImVec2::ImVec2(&label_pos,fVar5,fVar5);
        IVar6 = ::operator+((ImVec2 *)local_84,&label_pos);
        RenderCheckMark(pIVar1,IVar6,(ImU32)pad.y,fVar4 - (fVar5 + fVar5));
      }
      ImVec2::ImVec2(&local_e0,check_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                     (float)local_84._4_4_ + (pIVar2->Style).FramePadding.y);
      if ((pIVar2->LogEnabled & 1U) != 0) {
        if ((pad.x._3_1_ & 1) == 0) {
          if ((*v & 1U) == 0) {
            local_158 = "[ ]";
          }
          else {
            local_158 = "[x]";
          }
          local_150 = local_158;
        }
        else {
          local_150 = "[~]";
        }
        LogRenderedText(&local_e0,local_150,(char *)0x0);
      }
      if (0.0 < pos.y) {
        RenderText(local_e0,label,(char *)0x0,true);
      }
      label_local._7_1_ = (bool)(check_bb.Max.x._1_1_ & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
    {
        IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
        return false;
    }

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    bool mixed_value = (g.LastItemData.InFlags & ImGuiItemFlags_MixedValue) != 0;
    if (mixed_value)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        // This may seem awkwardly designed because the aim is to make ImGuiItemFlags_MixedValue supported by all widgets (not just checkbox)
        ImVec2 pad(ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)), ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)));
        window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
    }
    else if (*v)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad * 2.0f);
    }

    ImVec2 label_pos = ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y);
    if (g.LogEnabled)
        LogRenderedText(&label_pos, mixed_value ? "[~]" : *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(label_pos, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}